

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O2

int coda_bin_cursor_read_uint8(coda_cursor *cursor,uint8_t *dst)

{
  ulong bit_offset;
  int iVar1;
  coda_type *pcVar2;
  int iVar3;
  int64_t bit_size;
  char s2 [21];
  char s1 [21];
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  bit_size = pcVar2->bit_size;
  bit_offset = cursor->stack[(long)cursor->n + -1].bit_offset;
  iVar3 = -1;
  if (bit_size == -1) {
    iVar1 = coda_bin_cursor_get_bit_size(cursor,&bit_size);
    if (iVar1 != 0) {
      return -1;
    }
    if (8 < (ulong)bit_size) {
      coda_str64(bit_size,s1);
      coda_str64(cursor->stack[(long)cursor->n + -1].bit_offset >> 3,s2);
      coda_set_error(-300,
                     "possible product error detected (invalid bit size (%s) for binary uint8 integer - byte:bit offset = %s:%d)"
                     ,s1,s2,(ulong)((uint)cursor->stack[(long)cursor->n + -1].bit_offset & 7));
      return -1;
    }
  }
  if (((bit_offset & 7) == 0) && (bit_size == 8)) {
    iVar1 = read_bytes(cursor->product,(long)bit_offset >> 3,1,dst);
  }
  else {
    if (1 < (long)(((bit_size >> 3) + 1) - (ulong)((bit_size & 7U) == 0))) {
      __assert_fail("bit_size_to_byte_size(bit_size) <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin-cursor.c"
                    ,0xe9,"int coda_bin_cursor_read_uint8(const coda_cursor *, uint8_t *)");
    }
    *dst = '\0';
    iVar1 = read_bits(cursor->product,bit_offset,bit_size,dst);
  }
  if (iVar1 == 0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int coda_bin_cursor_read_uint8(const coda_cursor *cursor, uint8_t *dst)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_size = type->bit_size;
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;

    if (bit_size == -1)
    {
        if (coda_bin_cursor_get_bit_size(cursor, &bit_size) != 0)
        {
            return -1;
        }
        if (bit_size < 0 || bit_size > 8)
        {
            char s1[21];
            char s2[21];

            coda_str64(bit_size, s1);
            coda_str64(cursor->stack[cursor->n - 1].bit_offset >> 3, s2);
            coda_set_error(CODA_ERROR_PRODUCT,
                           "possible product error detected (invalid bit size (%s) for binary uint8 integer - "
                           "byte:bit offset = %s:%d)", s1, s2, (int)(cursor->stack[cursor->n - 1].bit_offset & 0x7));
            return -1;
        }
    }
    if ((bit_offset & 0x7) || bit_size != 8)
    {
        assert(bit_size_to_byte_size(bit_size) <= 1);
        *dst = 0;
        if (read_bits(cursor->product, bit_offset, bit_size, (uint8_t *)dst) != 0)
        {
            return -1;
        }
    }
    else
    {
        if (read_bytes(cursor->product, bit_offset >> 3, 1, dst) != 0)
        {
            return -1;
        }
    }

    return 0;
}